

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O0

void readInt(void)

{
  fprintf((FILE *)ofp,"Readint:\n");
  fprintf((FILE *)ofp,"         xor       cx, cx\n");
  fprintf((FILE *)ofp,"         mov       bx, 10\n");
  fprintf((FILE *)ofp,"Re1:\n");
  fprintf((FILE *)ofp,"         mov       ah, 01h\n");
  fprintf((FILE *)ofp,"         int       21h\n");
  fprintf((FILE *)ofp,"         cmp       al, 13\n");
  fprintf((FILE *)ofp,"         jz        Re2\n");
  fprintf((FILE *)ofp,"         and       ax, 0fh\n");
  fprintf((FILE *)ofp,"         xchg      ax, cx\n");
  fprintf((FILE *)ofp,"         mul       bx\n");
  fprintf((FILE *)ofp,"         add       ax, cx\n");
  fprintf((FILE *)ofp,"         xchg      ax, cx\n");
  fprintf((FILE *)ofp,"         jmp       Re1\n");
  fprintf((FILE *)ofp,"Re2:\n");
  fprintf((FILE *)ofp,"         ret\n");
  return;
}

Assistant:

void     readInt()
{
    fprintf(ofp, "Readint:\n");
    fprintf(ofp, "         xor       cx, cx\n");
    fprintf(ofp, "         mov       bx, 10\n");
    fprintf(ofp, "Re1:\n");
    fprintf(ofp, "         mov       ah, 01h\n");
    fprintf(ofp, "         int       21h\n");
    fprintf(ofp, "         cmp       al, 13\n");
    fprintf(ofp, "         jz        Re2\n");
    
    fprintf(ofp, "         and       ax, 0fh\n");
    fprintf(ofp, "         xchg      ax, cx\n");
    fprintf(ofp, "         mul       bx\n");
    fprintf(ofp, "         add       ax, cx\n");
    fprintf(ofp, "         xchg      ax, cx\n");
    fprintf(ofp, "         jmp       Re1\n");
    
    fprintf(ofp, "Re2:\n");
    fprintf(ofp, "         ret\n");
}